

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globalcontext.cc
# Opt level: O0

void __thiscall
ContextInternal::restoreXml(ContextInternal *this,Element *el,AddrSpaceManager *manage)

{
  Element *pEVar1;
  bool bVar2;
  int4 iVar3;
  reference ppEVar4;
  string *psVar5;
  vector<TrackedContext,_std::allocator<TrackedContext>_> *vec;
  LowlevelError *this_00;
  string local_b0 [32];
  undefined1 local_90 [8];
  Address addr_1;
  undefined1 local_70 [8];
  Address addr;
  Address local_50;
  Element *local_40;
  Element *subel;
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_30;
  const_iterator iter;
  List *list;
  AddrSpaceManager *manage_local;
  Element *el_local;
  ContextInternal *this_local;
  
  iter._M_current = (Element **)Element::getChildren(el);
  local_30._M_current =
       (Element **)
       std::vector<Element_*,_std::allocator<Element_*>_>::begin
                 ((vector<Element_*,_std::allocator<Element_*>_> *)iter._M_current);
  do {
    subel = (Element *)
            std::vector<Element_*,_std::allocator<Element_*>_>::end
                      ((vector<Element_*,_std::allocator<Element_*>_> *)iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                        *)&subel);
    if (!bVar2) {
      return;
    }
    ppEVar4 = __gnu_cxx::
              __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
              ::operator*(&local_30);
    local_40 = *ppEVar4;
    psVar5 = Element::getName_abi_cxx11_(local_40);
    bVar2 = std::operator==(psVar5,"context_pointset");
    if (bVar2) {
      iVar3 = Element::getNumAttributes(local_40);
      pEVar1 = local_40;
      if (iVar3 == 0) {
        Address::Address(&local_50);
        Address::Address((Address *)&addr.offset);
        restoreContext(this,pEVar1,&local_50,(Address *)&addr.offset);
      }
      else {
        Address::restoreXml((Address *)local_70,local_40,manage);
        pEVar1 = local_40;
        Address::Address((Address *)&addr_1.offset);
        restoreContext(this,pEVar1,(Address *)local_70,(Address *)&addr_1.offset);
      }
    }
    else {
      psVar5 = Element::getName_abi_cxx11_(local_40);
      bVar2 = std::operator==(psVar5,"tracked_pointset");
      if (!bVar2) {
        this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
        Element::getName_abi_cxx11_(local_40);
        std::operator+((char *)local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Bad <context_points> tag: ");
        LowlevelError::LowlevelError(this_00,local_b0);
        __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      Address::restoreXml((Address *)local_90,local_40,manage);
      pEVar1 = local_40;
      vec = partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>::split
                      (&this->trackbase,(Address *)local_90);
      ContextDatabase::restoreTracked(pEVar1,manage,vec);
    }
    __gnu_cxx::
    __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    operator++(&local_30);
  } while( true );
}

Assistant:

void ContextInternal::restoreXml(const Element *el,const AddrSpaceManager *manage)

{
  const List &list(el->getChildren());
  List::const_iterator iter = list.begin();

  while(iter != list.end()) {
    const Element *subel = *iter;
    if (subel->getName() == "context_pointset") {
      if (subel->getNumAttributes()==0) {
	restoreContext(subel,Address(),Address());	// Restore the default value
      }
      else {
	Address addr = Address::restoreXml(subel,manage);
	restoreContext(subel,addr,Address());
      }
    }
    else if (subel->getName() == "tracked_pointset") {
      Address addr = Address::restoreXml(subel,manage);
      restoreTracked(subel,manage,trackbase.split(addr) );
    }
    else
      throw LowlevelError("Bad <context_points> tag: "+subel->getName());
    ++iter;
  }
}